

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrf.c
# Opt level: O3

void zgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  double dVar2;
  int_t *piVar3;
  int iVar4;
  int_t iVar5;
  int_t iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int_t *relax_end;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  int iVar16;
  int_t *piVar17;
  uint uVar18;
  long lVar19;
  int nseg;
  int *local_180;
  int *repfnz;
  int *segrep;
  uint local_164;
  fact_t local_160;
  int nseg1;
  int_t *local_158;
  int *local_150;
  int_t *xprune;
  superlu_options_t *local_140;
  int *local_138;
  doublecomplex *dense;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  int_t *local_e8;
  doublecomplex *tempv;
  int_t *xplore;
  int_t *local_d0;
  int_t *local_c8;
  int *local_c0;
  int *local_b8;
  SuperMatrix *local_b0;
  int *local_a8;
  int_t *local_a0;
  int_t *local_98;
  double local_90;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  int_t *local_68;
  int_t *local_60;
  long local_58;
  long local_50;
  flops_t *local_48;
  long local_40;
  long local_38;
  
  local_150 = (int *)CONCAT44(local_150._4_4_,relax);
  local_180 = etree;
  iVar4 = sp_ienv(6);
  local_160 = options->Fact;
  local_90 = options->DiagPivotThresh;
  local_a8 = stat->panel_histo;
  local_48 = stat->ops;
  uVar18 = A->nrow;
  local_108 = (ulong)uVar18;
  uVar7 = A->ncol;
  local_100 = (ulong)uVar7;
  local_164 = uVar7;
  if ((int)uVar18 < (int)uVar7) {
    local_164 = uVar18;
  }
  piVar17 = (int_t *)A->Store;
  local_40 = *(long *)(piVar17 + 2);
  local_98 = *(int_t **)(piVar17 + 4);
  local_a0 = *(int_t **)(piVar17 + 6);
  local_158 = *(int_t **)(piVar17 + 8);
  local_f8 = (ulong)(uint)panel_size;
  local_b0 = A;
  iVar5 = zLUMemInit(local_160,work,lwork,uVar18,uVar7,*piVar17,panel_size,(double)iVar4,L,U,Glu,
                     &iwork,&zwork);
  uVar11 = local_100;
  uVar12 = local_108;
  *info = iVar5;
  if (iVar5 != 0) {
    return;
  }
  local_b8 = Glu->xsup;
  local_c0 = Glu->supno;
  local_c8 = Glu->xlsub;
  local_d0 = Glu->xlusup;
  local_e8 = Glu->xusub;
  iVar9 = (int)local_108;
  iVar16 = (int)local_100;
  iVar4 = (int)local_f8;
  local_140 = options;
  SetIWork(iVar9,iVar16,iVar4,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
  zSetRWork(iVar9,iVar4,zwork,&dense,&tempv);
  usepr = (int)(local_160 == SamePattern_SameRowPerm);
  if (local_160 == SamePattern_SameRowPerm) {
    local_138 = int32Malloc(iVar9);
    iVar4 = (int)local_150;
    if (0 < iVar9) {
      uVar13 = 0;
      do {
        local_138[perm_r[uVar13]] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
  }
  else {
    local_138 = (int *)0x0;
    iVar4 = (int)local_150;
  }
  piVar17 = local_158;
  uVar18 = local_164;
  local_150 = int32Malloc(iVar16);
  if (0 < iVar16) {
    uVar12 = 0;
    do {
      local_150[perm_c[uVar12]] = (int)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  relax_end = intMalloc(iVar16);
  if (local_140->SymmetricMode == YES) {
    heap_relax_snode(iVar16,local_180,iVar4,marker,relax_end);
  }
  else {
    relax_snode(iVar16,local_180,iVar4,marker,relax_end);
  }
  uVar12 = local_108;
  iVar4 = (int)local_108;
  ifill(perm_r,iVar4,-1);
  ifill(marker,iVar4 * 3,-1);
  *local_c0 = -1;
  uVar11 = 0;
  *local_d0 = 0;
  *local_e8 = 0;
  *local_c8 = 0;
  *local_b8 = 0;
  if ((int)uVar18 < 1) {
    *info = 0;
  }
  else {
    local_68 = relax_end + 1;
    local_58 = (long)iVar4 * 4;
    local_50 = (long)iVar4 << 4;
    iVar4 = 0;
    local_60 = relax_end;
    do {
      iVar9 = (int)uVar11;
      lVar15 = (long)iVar9;
      iVar16 = local_60[lVar15];
      if (iVar16 == -1) {
        local_180 = (int *)(uVar11 & 0xffffffff);
        uVar7 = (int)local_f8 + iVar9;
        if ((int)uVar18 <= (int)uVar7) {
          uVar7 = uVar18;
        }
        uVar11 = 0;
        do {
          if ((long)(int)uVar7 <= (long)(lVar15 + 1 + uVar11)) {
            uVar7 = iVar9 + (int)uVar11 + 1;
            uVar13 = local_f8;
            goto LAB_00106096;
          }
          uVar13 = uVar11 + 1;
          lVar10 = lVar15 + uVar11;
          uVar11 = uVar13;
        } while (local_68[lVar10] == -1);
        uVar7 = iVar9 + (int)uVar13;
LAB_00106096:
        iVar16 = uVar18 - iVar9;
        if (uVar7 != uVar18) {
          iVar16 = (int)uVar13;
        }
        local_a8[iVar16] = local_a8[iVar16] + 1;
        zpanel_dfs((int)uVar12,iVar16,iVar9,local_b0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,
                   xprune,marker,parent,xplore,Glu);
        zpanel_bmod((int)uVar12,iVar16,iVar9,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar11 = (ulong)(uint)(iVar9 + iVar16);
        piVar17 = local_158;
        if (0 < iVar16) {
          local_140 = (superlu_options_t *)(long)(iVar9 + iVar16);
          lVar10 = 0;
          lVar19 = 0;
          local_f0 = uVar11;
          do {
            nseg = nseg1;
            iVar9 = (int)lVar15;
            iVar16 = zcolumn_dfs((int)local_108,iVar9,perm_r,&nseg,
                                 (int *)((long)panel_lsub + lVar19),segrep,
                                 (int *)((long)repfnz + lVar19),xprune,marker,parent,xplore,Glu);
            *info = iVar16;
            if (iVar16 != 0) {
              return;
            }
            iVar16 = zcolumn_bmod(iVar9,nseg - nseg1,(doublecomplex *)((long)&dense->r + lVar10),
                                  tempv,segrep + nseg1,(int *)((long)repfnz + lVar19),(int)local_180
                                  ,Glu,stat);
            *info = iVar16;
            if (iVar16 != 0) {
              return;
            }
            iVar16 = zcopy_to_ucol(iVar9,nseg,segrep,(int *)((long)repfnz + lVar19),perm_r,
                                   (doublecomplex *)((long)&dense->r + lVar10),Glu);
            *info = iVar16;
            if (iVar16 != 0) {
              return;
            }
            iVar8 = zpivotL(iVar9,local_90,&usepr,perm_r,local_138,local_150,&pivrow,Glu,stat);
            *info = iVar8;
            iVar16 = iVar4;
            if (iVar4 == 0) {
              iVar16 = iVar8;
            }
            if (iVar8 != 0) {
              iVar4 = iVar16;
            }
            zpruneL(iVar9,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar19),xprune,Glu);
            resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar19));
            lVar15 = lVar15 + 1;
            lVar19 = lVar19 + local_58;
            lVar10 = lVar10 + local_50;
            uVar11 = local_f0;
            piVar17 = local_158;
          } while (lVar15 < (long)local_140);
        }
      }
      else {
        local_a8[(long)(iVar16 - iVar9) + 1] = local_a8[(long)(iVar16 - iVar9) + 1] + 1;
        local_180 = (int *)CONCAT44(local_180._4_4_,iVar16);
        iVar5 = zsnode_dfs(iVar9,iVar16,local_98,local_a0,piVar17,xprune,marker,Glu);
        *info = iVar5;
        if (iVar5 != 0) {
          return;
        }
        local_140 = (superlu_options_t *)CONCAT44(local_140._4_4_,local_e8[lVar15]);
        iVar5 = local_d0[lVar15];
        local_f0 = (ulong)local_c0[lVar15];
        local_38 = (long)local_b8[local_f0];
        iVar8 = local_c8[local_38 + 1];
        iVar1 = local_c8[local_38];
        nzlumax = Glu->nzlumax;
        while (piVar17 = local_158, nzlumax < (iVar8 - iVar1) * ((iVar16 - iVar9) + 1) + iVar5) {
          iVar6 = zLUMemXpand(iVar9,iVar5,LUSUP,&nzlumax,Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
        }
        if (iVar9 <= (int)local_180) {
          local_180 = (int *)CONCAT44(local_180._4_4_,(int)local_180 + 1);
          do {
            local_e8[lVar15 + 1] = (int_t)local_140;
            lVar10 = (long)local_a0[lVar15];
            if (local_a0[lVar15] < piVar17[lVar15]) {
              pdVar14 = (double *)(lVar10 * 0x10 + local_40);
              do {
                iVar16 = local_98[lVar10];
                dVar2 = pdVar14[1];
                dense[iVar16].r = *pdVar14;
                dense[iVar16].i = dVar2;
                lVar10 = lVar10 + 1;
                pdVar14 = pdVar14 + 2;
              } while (lVar10 < piVar17[lVar15]);
            }
            lVar10 = lVar15 + 1;
            zsnode_bmod((int)lVar15,(int)local_f0,(int)local_38,dense,tempv,Glu,stat);
            iVar9 = zpivotL((int)lVar15,local_90,&usepr,perm_r,local_138,local_150,&pivrow,Glu,stat)
            ;
            *info = iVar9;
            iVar16 = iVar4;
            if (iVar4 == 0) {
              iVar16 = iVar9;
            }
            if (iVar9 != 0) {
              iVar4 = iVar16;
            }
            lVar15 = lVar10;
          } while ((int)local_180 != (int)lVar10);
          uVar11 = (ulong)local_180 & 0xffffffff;
        }
      }
      uVar12 = local_108;
      uVar18 = local_164;
    } while ((int)uVar11 < (int)local_164);
    *info = iVar4;
    iVar16 = iVar4 + -1;
    relax_end = local_60;
    if (iVar4 != 0) goto LAB_001064b6;
  }
  iVar16 = (int)local_100;
LAB_001064b6:
  iVar4 = (int)uVar12;
  if (0 < iVar4 && iVar16 < iVar4) {
    uVar11 = 1;
    do {
      if (perm_r[uVar11 - 1] == -1) {
        perm_r[uVar11 - 1] = iVar16;
        iVar16 = iVar16 + 1;
      }
    } while ((uVar11 < uVar12) && (uVar11 = uVar11 + 1, iVar16 < iVar4));
  }
  countnz(uVar18,xprune,&nnzL,&nnzU,Glu);
  fixupL(uVar18,perm_r,Glu);
  zLUWorkFree(iwork,zwork,Glu);
  superlu_free(xplore);
  superlu_free(xprune);
  if (local_160 == SamePattern_SameRowPerm) {
    piVar17 = (int_t *)L->Store;
    *piVar17 = nnzL;
    piVar17[1] = Glu->supno[(int)local_100];
    piVar3 = Glu->xlusup;
    *(void **)(piVar17 + 2) = Glu->lusup;
    *(int_t **)(piVar17 + 4) = piVar3;
    piVar3 = Glu->xlsub;
    *(int_t **)(piVar17 + 6) = Glu->lsub;
    *(int_t **)(piVar17 + 8) = piVar3;
    piVar17 = (int_t *)U->Store;
    *piVar17 = nnzU;
    piVar3 = Glu->usub;
    *(void **)(piVar17 + 2) = Glu->ucol;
    *(int_t **)(piVar17 + 4) = piVar3;
    *(int_t **)(piVar17 + 6) = Glu->xusub;
  }
  else {
    zCreate_SuperNode_Matrix
              (L,local_b0->nrow,uVar18,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
               Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
    zCreate_CompCol_Matrix
              (U,uVar18,uVar18,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z,
               SLU_TRU);
  }
  local_48[7] = local_48[0x13] + local_48[0x14] + local_48[7];
  iVar4 = Glu->num_expansions + -1;
  Glu->num_expansions = iVar4;
  stat->expansions = iVar4;
  if (local_160 == SamePattern_SameRowPerm) {
    superlu_free(local_138);
  }
  superlu_free(local_150);
  superlu_free(relax_end);
  return;
}

Assistant:

void
zgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    doublecomplex    *zwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    doublecomplex    *dense, *tempv;
    int       *relax_end;
    doublecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    zSetRWork(m, panel_size, zwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = zpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = zcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	zpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (doublecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_Z, SLU_TRLU);
    	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_Z, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}